

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O3

void __thiscall
Assimp::ValidateDSProcess::Validate
          (ValidateDSProcess *this,aiAnimation *pAnimation,aiNodeAnim *pNodeAnim)

{
  double dVar1;
  uint uVar2;
  aiVectorKey *paVar3;
  aiQuatKey *paVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  
  Validate(this,&pNodeAnim->mNodeName);
  uVar6 = (ulong)pNodeAnim->mNumPositionKeys;
  if (pNodeAnim->mNumPositionKeys == 0) {
    if ((pNodeAnim->mScalingKeys == (aiVectorKey *)0x0) && (pNodeAnim->mNumRotationKeys == 0)) {
      pcVar7 = "Empty node animation channel";
      goto LAB_002fe8c4;
    }
  }
  else {
    paVar3 = pNodeAnim->mPositionKeys;
    if (paVar3 == (aiVectorKey *)0x0) {
      pcVar7 = "aiNodeAnim::mPositionKeys is NULL (aiNodeAnim::mNumPositionKeys is %i)";
      goto LAB_002fe8ad;
    }
    dVar10 = -100000000000.0;
    lVar8 = 0;
    uVar9 = 0;
    do {
      dVar11 = pAnimation->mDuration;
      if ((0.0 < dVar11) &&
         (dVar1 = *(double *)((long)&paVar3->mTime + lVar8), dVar11 + 0.001 < dVar1)) {
        dVar10 = (double)(float)dVar1;
        dVar11 = (double)(float)dVar11;
        pcVar7 = 
        "aiNodeAnim::mPositionKeys[%i].mTime (%.5f) is larger than aiAnimation::mDuration (which is %.5f)"
        ;
        goto LAB_002fe888;
      }
      if ((uVar9 != 0) && (dVar11 = *(double *)((long)&paVar3->mTime + lVar8), dVar11 <= dVar10)) {
        ReportWarning(this,
                      "aiNodeAnim::mPositionKeys[%i].mTime (%.5f) is smaller than aiAnimation::mPositionKeys[%i] (which is %.5f)"
                      ,(double)(float)dVar11,(double)(float)dVar10,uVar9 & 0xffffffff,
                      (ulong)((int)uVar9 - 1));
        paVar3 = pNodeAnim->mPositionKeys;
        uVar6 = (ulong)pNodeAnim->mNumPositionKeys;
      }
      dVar10 = *(double *)((long)&paVar3->mTime + lVar8);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x18;
    } while (uVar9 < uVar6);
  }
  uVar6 = (ulong)pNodeAnim->mNumRotationKeys;
  if (pNodeAnim->mNumRotationKeys == 0) {
    uVar6 = 0;
  }
  else {
    paVar4 = pNodeAnim->mRotationKeys;
    if (paVar4 == (aiQuatKey *)0x0) {
      pcVar7 = "aiNodeAnim::mRotationKeys is NULL (aiNodeAnim::mNumRotationKeys is %i)";
      goto LAB_002fe8ad;
    }
    dVar10 = -100000000000.0;
    lVar8 = 0;
    uVar9 = 0;
    do {
      dVar11 = pAnimation->mDuration;
      if ((0.0 < dVar11) &&
         (dVar1 = *(double *)((long)&paVar4->mTime + lVar8), dVar11 + 0.001 < dVar1)) {
        dVar10 = (double)(float)dVar1;
        dVar11 = (double)(float)dVar11;
        pcVar7 = 
        "aiNodeAnim::mRotationKeys[%i].mTime (%.5f) is larger than aiAnimation::mDuration (which is %.5f)"
        ;
        goto LAB_002fe888;
      }
      if ((uVar9 != 0) && (dVar11 = *(double *)((long)&paVar4->mTime + lVar8), dVar11 <= dVar10)) {
        ReportWarning(this,
                      "aiNodeAnim::mRotationKeys[%i].mTime (%.5f) is smaller than aiAnimation::mRotationKeys[%i] (which is %.5f)"
                      ,(double)(float)dVar11,(double)(float)dVar10,uVar9 & 0xffffffff,
                      (ulong)((int)uVar9 - 1));
        paVar4 = pNodeAnim->mRotationKeys;
        uVar6 = (ulong)pNodeAnim->mNumRotationKeys;
      }
      dVar10 = *(double *)((long)&paVar4->mTime + lVar8);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x18;
    } while (uVar9 < uVar6);
  }
  uVar5 = (uint)uVar6;
  uVar2 = pNodeAnim->mNumScalingKeys;
  if (uVar2 != 0) {
    paVar3 = pNodeAnim->mScalingKeys;
    if (paVar3 == (aiVectorKey *)0x0) {
      pcVar7 = "aiNodeAnim::mScalingKeys is NULL (aiNodeAnim::mNumScalingKeys is %i)";
      uVar6 = (ulong)uVar2;
LAB_002fe8ad:
      ReportError(this,pcVar7,uVar6);
    }
    dVar10 = -100000000000.0;
    lVar8 = 0;
    uVar9 = 0;
    do {
      dVar11 = pAnimation->mDuration;
      if ((0.0 < dVar11) &&
         (dVar1 = *(double *)((long)&paVar3->mTime + lVar8), dVar11 + 0.001 < dVar1)) {
        dVar10 = (double)(float)dVar1;
        dVar11 = (double)(float)dVar11;
        pcVar7 = 
        "aiNodeAnim::mScalingKeys[%i].mTime (%.5f) is larger than aiAnimation::mDuration (which is %.5f)"
        ;
LAB_002fe888:
        ReportError(this,pcVar7,dVar10,dVar11,uVar9 & 0xffffffff);
      }
      if ((uVar9 != 0) && (dVar11 = *(double *)((long)&paVar3->mTime + lVar8), dVar11 <= dVar10)) {
        ReportWarning(this,
                      "aiNodeAnim::mScalingKeys[%i].mTime (%.5f) is smaller than aiAnimation::mScalingKeys[%i] (which is %.5f)"
                      ,(double)(float)dVar11,(double)(float)dVar10,uVar9 & 0xffffffff,
                      (ulong)((int)uVar9 - 1));
        paVar3 = pNodeAnim->mScalingKeys;
        uVar2 = pNodeAnim->mNumScalingKeys;
      }
      dVar10 = *(double *)((long)&paVar3->mTime + lVar8);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x18;
    } while (uVar9 < uVar2);
    if (uVar2 != 0) {
      return;
    }
    uVar5 = pNodeAnim->mNumRotationKeys;
  }
  if ((uVar5 != 0) || (pNodeAnim->mNumPositionKeys != 0)) {
    return;
  }
  pcVar7 = "A node animation channel must have at least one subtrack";
LAB_002fe8c4:
  ReportError(this,pcVar7);
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation,
     const aiNodeAnim* pNodeAnim)
{
    Validate(&pNodeAnim->mNodeName);

    if (!pNodeAnim->mNumPositionKeys && !pNodeAnim->mScalingKeys && !pNodeAnim->mNumRotationKeys) {
        ReportError("Empty node animation channel");
    }
    // otherwise check whether one of the keys exceeds the total duration of the animation
    if (pNodeAnim->mNumPositionKeys)
    {
        if (!pNodeAnim->mPositionKeys)
        {
        	ReportError("aiNodeAnim::mPositionKeys is NULL (aiNodeAnim::mNumPositionKeys is %i)",
                pNodeAnim->mNumPositionKeys);
        }
        double dLast = -10e10;
        for (unsigned int i = 0; i < pNodeAnim->mNumPositionKeys;++i)
        {
            // ScenePreprocessor will compute the duration if still the default value
            // (Aramis) Add small epsilon, comparison tended to fail if max_time == duration,
            //  seems to be due the compilers register usage/width.
            if (pAnimation->mDuration > 0. && pNodeAnim->mPositionKeys[i].mTime > pAnimation->mDuration+0.001)
            {
                ReportError("aiNodeAnim::mPositionKeys[%i].mTime (%.5f) is larger "
                    "than aiAnimation::mDuration (which is %.5f)",i,
                    (float)pNodeAnim->mPositionKeys[i].mTime,
                    (float)pAnimation->mDuration);
            }
            if (i && pNodeAnim->mPositionKeys[i].mTime <= dLast)
            {
                ReportWarning("aiNodeAnim::mPositionKeys[%i].mTime (%.5f) is smaller "
                    "than aiAnimation::mPositionKeys[%i] (which is %.5f)",i,
                    (float)pNodeAnim->mPositionKeys[i].mTime,
                    i-1, (float)dLast);
            }
            dLast = pNodeAnim->mPositionKeys[i].mTime;
        }
    }
    // rotation keys
    if (pNodeAnim->mNumRotationKeys)
    {
        if (!pNodeAnim->mRotationKeys)
        {
            ReportError("aiNodeAnim::mRotationKeys is NULL (aiNodeAnim::mNumRotationKeys is %i)",
                pNodeAnim->mNumRotationKeys);
        }
        double dLast = -10e10;
        for (unsigned int i = 0; i < pNodeAnim->mNumRotationKeys;++i)
        {
            if (pAnimation->mDuration > 0. && pNodeAnim->mRotationKeys[i].mTime > pAnimation->mDuration+0.001)
            {
                ReportError("aiNodeAnim::mRotationKeys[%i].mTime (%.5f) is larger "
                    "than aiAnimation::mDuration (which is %.5f)",i,
                    (float)pNodeAnim->mRotationKeys[i].mTime,
                    (float)pAnimation->mDuration);
            }
            if (i && pNodeAnim->mRotationKeys[i].mTime <= dLast)
            {
                ReportWarning("aiNodeAnim::mRotationKeys[%i].mTime (%.5f) is smaller "
                    "than aiAnimation::mRotationKeys[%i] (which is %.5f)",i,
                    (float)pNodeAnim->mRotationKeys[i].mTime,
                    i-1, (float)dLast);
            }
            dLast = pNodeAnim->mRotationKeys[i].mTime;
        }
    }
    // scaling keys
    if (pNodeAnim->mNumScalingKeys)
    {
        if (!pNodeAnim->mScalingKeys)   {
            ReportError("aiNodeAnim::mScalingKeys is NULL (aiNodeAnim::mNumScalingKeys is %i)",
                pNodeAnim->mNumScalingKeys);
        }
        double dLast = -10e10;
        for (unsigned int i = 0; i < pNodeAnim->mNumScalingKeys;++i)
        {
            if (pAnimation->mDuration > 0. && pNodeAnim->mScalingKeys[i].mTime > pAnimation->mDuration+0.001)
            {
                ReportError("aiNodeAnim::mScalingKeys[%i].mTime (%.5f) is larger "
                    "than aiAnimation::mDuration (which is %.5f)",i,
                    (float)pNodeAnim->mScalingKeys[i].mTime,
                    (float)pAnimation->mDuration);
            }
            if (i && pNodeAnim->mScalingKeys[i].mTime <= dLast)
            {
                ReportWarning("aiNodeAnim::mScalingKeys[%i].mTime (%.5f) is smaller "
                    "than aiAnimation::mScalingKeys[%i] (which is %.5f)",i,
                    (float)pNodeAnim->mScalingKeys[i].mTime,
                    i-1, (float)dLast);
            }
            dLast = pNodeAnim->mScalingKeys[i].mTime;
        }
    }

    if (!pNodeAnim->mNumScalingKeys && !pNodeAnim->mNumRotationKeys &&
        !pNodeAnim->mNumPositionKeys)
    {
        ReportError("A node animation channel must have at least one subtrack");
    }
}